

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O2

void set_hero_sprite_for_room(tgestate_t *state)

{
  byte bVar1;
  
  state->vischars[0].input = 0x80;
  bVar1 = state->vischars[0].direction;
  if (0x1c < state->room_index) {
    state->vischars[0].direction = bVar1 | 4;
    state->vischars[0].mi.sprite = sprites + 2;
    return;
  }
  state->vischars[0].direction = bVar1 & 0xfb;
  return;
}

Assistant:

void set_hero_sprite_for_room(tgestate_t *state)
{
  vischar_t *hero; /* was HL */

  assert(state != NULL);

  hero = &state->vischars[0];
  hero->input = input_KICK;

  /* vischar_DIRECTION_CRAWL is set, or cleared, here but not tested
   * directly anywhere else so it must be an offset into animindices[].
   */

  /* When in tunnel rooms force the hero sprite to 'prisoner' and set the
   * crawl flag appropriately. */
  if (state->room_index >= room_29_SECOND_TUNNEL_START)
  {
    hero->direction |= vischar_DIRECTION_CRAWL;
    hero->mi.sprite = &sprites[sprite_PRISONER_FACING_AWAY_1];
  }
  else
  {
    hero->direction &= ~vischar_DIRECTION_CRAWL;
  }
}